

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

bool sf::priv::JoystickImpl::isConnected(uint index)

{
  undefined1 uVar1;
  uint __i;
  int iVar2;
  int iVar3;
  long lVar4;
  udev_device *udevDevice;
  ulong uVar5;
  timeval local_a8;
  fd_set descriptorSet;
  
  if ((anonymous_namespace)::udevMonitor == 0) {
    anon_unknown.dwarf_9f7fb::updatePluggedList((udev_device *)0x0);
  }
  else {
    iVar2 = udev_monitor_get_fd();
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      descriptorSet.fds_bits[lVar4] = 0;
    }
    uVar5 = 1L << ((byte)iVar2 & 0x3f);
    descriptorSet.fds_bits[iVar2 / 0x40] = descriptorSet.fds_bits[iVar2 / 0x40] | uVar5;
    local_a8.tv_sec = 0;
    local_a8.tv_usec = 0;
    iVar3 = select(iVar2 + 1,(fd_set *)&descriptorSet,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
    if ((0 < iVar3) && ((descriptorSet.fds_bits[iVar2 / 0x40] & uVar5) != 0)) {
      udevDevice = (udev_device *)udev_monitor_receive_device((anonymous_namespace)::udevMonitor);
      anon_unknown.dwarf_9f7fb::updatePluggedList(udevDevice);
      if (udevDevice != (udev_device *)0x0) {
        udev_device_unref(udevDevice);
      }
    }
  }
  if ((ulong)index < (ulong)((DAT_0021a8b0 - (anonymous_namespace)::joystickList) / 0x48)) {
    uVar1 = *(undefined1 *)((anonymous_namespace)::joystickList + 0x40 + (ulong)index * 0x48);
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool JoystickImpl::isConnected(unsigned int index)
{
    // See if we can skip scanning if udev monitor is available
    if (!udevMonitor)
    {
        // udev monitor is not available, perform a scan every query
        updatePluggedList();
    }
    else if (hasMonitorEvent())
    {
        // Check if new joysticks were added/removed since last update
        udev_device* udevDevice = udev_monitor_receive_device(udevMonitor);

        // If we can get the specific device, we check that,
        // otherwise just do a full scan if udevDevice == NULL
        updatePluggedList(udevDevice);

        if (udevDevice)
            udev_device_unref(udevDevice);
    }

    if (index >= joystickList.size())
        return false;

    // Then check if the joystick is connected
    return joystickList[index].plugged;
}